

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetMetricDecoderCreateExp
          (zet_metric_tracer_exp_handle_t hMetricTracer,
          zet_metric_decoder_exp_handle_t *phMetricDecoder)

{
  zet_metric_decoder_exp_handle_t p_Var1;
  zet_pfnMetricDecoderCreateExp_t pfnCreateExp;
  ze_result_t result;
  zet_metric_decoder_exp_handle_t *phMetricDecoder_local;
  zet_metric_tracer_exp_handle_t hMetricTracer_local;
  
  pfnCreateExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c7e0 == (code *)0x0) {
    p_Var1 = (zet_metric_decoder_exp_handle_t)context_t::get((context_t *)&context);
    *phMetricDecoder = p_Var1;
  }
  else {
    pfnCreateExp._4_4_ = (*DAT_0011c7e0)(hMetricTracer,phMetricDecoder);
  }
  return pfnCreateExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricDecoderCreateExp(
        zet_metric_tracer_exp_handle_t hMetricTracer,   ///< [in] handle of the metric tracer
        zet_metric_decoder_exp_handle_t* phMetricDecoder///< [out] handle of the metric decoder object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCreateExp = context.zetDdiTable.MetricDecoderExp.pfnCreateExp;
        if( nullptr != pfnCreateExp )
        {
            result = pfnCreateExp( hMetricTracer, phMetricDecoder );
        }
        else
        {
            // generic implementation
            *phMetricDecoder = reinterpret_cast<zet_metric_decoder_exp_handle_t>( context.get() );

        }

        return result;
    }